

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void setPragmaResultColumnNames(Vdbe *v,PragmaName *pPragma)

{
  byte bVar1;
  byte bVar2;
  uint nResColumn;
  long lVar3;
  
  bVar1 = pPragma->nPragCName;
  nResColumn = 1;
  if (bVar1 != 0) {
    nResColumn = (uint)bVar1;
  }
  sqlite3VdbeSetNumCols(v,nResColumn);
  if (bVar1 != 0) {
    bVar2 = pPragma->iPragCName;
    for (lVar3 = 0; (uint)bVar1 != (uint)lVar3; lVar3 = lVar3 + 1) {
      sqlite3VdbeSetColName
                (v,(uint)lVar3,0,pragCName[lVar3 + (ulong)bVar2],(_func_void_void_ptr *)0x0);
    }
    return;
  }
  sqlite3VdbeSetColName(v,0,0,pPragma->zName,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

static void setPragmaResultColumnNames(
  Vdbe *v,                     /* The query under construction */
  const PragmaName *pPragma    /* The pragma */
){
  u8 n = pPragma->nPragCName;
  sqlite3VdbeSetNumCols(v, n==0 ? 1 : n);
  if( n==0 ){
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, pPragma->zName, SQLITE_STATIC);
  }else{
    int i, j;
    for(i=0, j=pPragma->iPragCName; i<n; i++, j++){
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, pragCName[j], SQLITE_STATIC);
    }
  }
}